

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.hpp
# Opt level: O2

any * __thiscall linb::any::operator=(any *this,shared_ptr<Var> *value)

{
  storage_union local_28;
  undefined1 *local_18;
  
  local_18 = vtable_for_type<std::shared_ptr<Var>>()::table;
  local_28.dynamic = (value->super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_28._8_8_ = (value->super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (value->super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (value->super___shared_ptr<Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = (element_type *)0x0;
  swap((any *)&local_28,this);
  if (local_18 != (undefined1 *)0x0) {
    (**(code **)(local_18 + 8))(&local_28);
  }
  return this;
}

Assistant:

any& operator=(ValueType&& value)
    {
        static_assert(std::is_copy_constructible<typename std::decay<ValueType>::type>::value,
            "T shall satisfy the CopyConstructible requirements.");
        any(std::forward<ValueType>(value)).swap(*this);
        return *this;
    }